

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shproject.hpp
# Opt level: O2

void __thiscall SymmSH<15>::SymmSH(SymmSH<15> *this,function<float_(float)> *func,int nsample)

{
  float fVar1;
  double dVar2;
  int i;
  long lVar3;
  int iVar4;
  int iVar5;
  float __x;
  float fVar6;
  float fVar7;
  double dVar8;
  vec3f w;
  double acc [15];
  float y [225];
  
  this->a[0xb] = 0.0;
  this->a[0xc] = 0.0;
  this->a[0xd] = 0.0;
  this->a[0xe] = 0.0;
  this->a[8] = 0.0;
  this->a[9] = 0.0;
  this->a[10] = 0.0;
  this->a[0xb] = 0.0;
  this->a[4] = 0.0;
  this->a[5] = 0.0;
  this->a[6] = 0.0;
  this->a[7] = 0.0;
  this->a[0] = 0.0;
  this->a[1] = 0.0;
  this->a[2] = 0.0;
  this->a[3] = 0.0;
  acc[0xc] = 0.0;
  acc[0xd] = 0.0;
  acc[10] = 0.0;
  acc[0xb] = 0.0;
  acc[8] = 0.0;
  acc[9] = 0.0;
  acc[6] = 0.0;
  acc[7] = 0.0;
  acc[4] = 0.0;
  acc[5] = 0.0;
  acc[2] = 0.0;
  acc[3] = 0.0;
  acc[0] = 0.0;
  acc[1] = 0.0;
  acc[0xe] = 0.0;
  iVar5 = 0;
  iVar4 = nsample;
  if (nsample < 1) {
    iVar4 = 0;
  }
  dVar8 = 0.0;
  for (; dVar2 = (double)PI, iVar5 != iVar4; iVar5 = iVar5 + 1) {
    __x = (float)(((dVar8 + 0.5) * dVar2) / (double)nsample);
    fVar6 = sinf(__x);
    w.z = cosf(__x);
    w.y = 0.0;
    w.x = fVar6;
    SHEvaluate(&w,0xe,y);
    fVar6 = std::function<float_(float)>::operator()(func,__x);
    lVar3 = 0;
    while (lVar3 != 0xf) {
      fVar1 = y[(lVar3 + 1) * lVar3];
      fVar7 = sinf(__x);
      acc[lVar3] = (double)(fVar7 * fVar1 * fVar6) + acc[lVar3];
      lVar3 = lVar3 + 1;
    }
    dVar8 = dVar8 + 1.0;
  }
  for (lVar3 = 0; lVar3 != 0xf; lVar3 = lVar3 + 1) {
    this->a[lVar3] = (float)(((acc[lVar3] + acc[lVar3]) * dVar2 * dVar2) / (double)nsample);
  }
  return;
}

Assistant:

SymmSH<n>::SymmSH(std::function<float(float)> func, int nsample)
{
    double acc[n];
    memset(acc, 0, sizeof acc);
    float y[n*n];
    for (int i=0; i<nsample; ++i)
    {
        float theta = PI*(i+0.5)/nsample;
        vec3f w(sin(theta), 0, cos(theta));
        SHEvaluate(w, n-1, y);
        float f = func(theta);
        for (int i=0; i<n; ++i)
            acc[i] += f * y[SHIndex(i,0)] * sin(theta);
    }
    for (int i=0; i<n; ++i)
        a[i] = acc[i] * 2*PI*PI / nsample;
}